

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

bool __thiscall
nestl::impl::list_const_iterator<int>::operator==
          (list_const_iterator<int> *this,list_const_iterator<int> *other)

{
  list_const_iterator<int> *other_local;
  list_const_iterator<int> *this_local;
  
  if (this->m_node == (list_node_base *)0x0) {
    __assert_fail("m_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x187,
                  "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
                 );
  }
  if (this->m_node->m_prev == (list_node_base *)0x0) {
    __assert_fail("(m_node)->m_prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x187,
                  "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
                 );
  }
  if (this->m_node->m_next == (list_node_base *)0x0) {
    __assert_fail("(m_node)->m_next",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x187,
                  "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
                 );
  }
  if (this->m_node->m_prev->m_next != this->m_node) {
    __assert_fail("(m_node)->m_prev->m_next == (m_node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x187,
                  "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
                 );
  }
  if (this->m_node->m_next->m_prev != this->m_node) {
    __assert_fail("(m_node)->m_next->m_prev == (m_node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x187,
                  "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
                 );
  }
  if (other->m_node == (list_node_base *)0x0) {
    __assert_fail("other.m_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x188,
                  "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
                 );
  }
  if (other->m_node->m_prev == (list_node_base *)0x0) {
    __assert_fail("(other.m_node)->m_prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x188,
                  "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
                 );
  }
  if (other->m_node->m_next != (list_node_base *)0x0) {
    if (other->m_node->m_prev->m_next != other->m_node) {
      __assert_fail("(other.m_node)->m_prev->m_next == (other.m_node)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                    ,0x188,
                    "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
                   );
    }
    if (other->m_node->m_next->m_prev == other->m_node) {
      return this->m_node == other->m_node;
    }
    __assert_fail("(other.m_node)->m_next->m_prev == (other.m_node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                  ,0x188,
                  "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
                 );
  }
  __assert_fail("(other.m_node)->m_next",
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                ,0x188,
                "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
               );
}

Assistant:

bool operator==(const list_const_iterator& other) const NESTL_NOEXCEPT_SPEC
    {
        NESTL_CHECK_LIST_NODE(m_node);
        NESTL_CHECK_LIST_NODE(other.m_node);

        return m_node == other.m_node;
    }